

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O2

void Ivy_ManHaigSimulate(Ivy_Man_t *p)

{
  Ivy_Man_t *p_00;
  int iVar1;
  Ivy_Init_t IVar2;
  Ivy_Init_t IVar3;
  uint uVar4;
  void *pvVar5;
  Ivy_Obj_t *pIVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  Ivy_Obj_t *pIVar9;
  ulong uVar10;
  Vec_Int_t *vLatches;
  uint local_3c;
  Vec_Int_t *local_38;
  
  Ivy_ManCheckChoices(p);
  p_00 = p->pHaig;
  if (p_00 == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                  ,0x1c4,"void Ivy_ManHaigSimulate(Ivy_Man_t *)");
  }
  local_38 = Ivy_ManDfsSeq(p_00,&vLatches);
  *(uint *)&p_00->pConst1->field_0x8 = *(uint *)&p_00->pConst1->field_0x8 & 0xfffff9ff | 0x400;
  for (iVar7 = 0; iVar7 < p_00->vPis->nSize; iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(p_00->vPis,iVar7);
    *(uint *)((long)pvVar5 + 8) = *(uint *)((long)pvVar5 + 8) & 0xfffff9ff | 0x200;
  }
  for (iVar7 = 0; iVar7 < vLatches->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vLatches,iVar7);
    pIVar6 = Ivy_ManObj(p_00,iVar1);
    if (pIVar6 == (Ivy_Obj_t *)0x0) break;
    pIVar6->field_0x9 = pIVar6->field_0x9 | 6;
  }
  pVVar8 = (Vec_Int_t *)p_00->pData;
  for (iVar7 = 0; iVar7 < pVVar8->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(pVVar8,iVar7);
    pIVar6 = Ivy_ManObj(p_00,iVar1);
    if (pIVar6 == (Ivy_Obj_t *)0x0) break;
    *(uint *)&pIVar6->field_0x8 = *(uint *)&pIVar6->field_0x8 & 0xfffff9ff | 0x200;
  }
  uVar4 = 0;
  pVVar8 = local_38;
  do {
    if (uVar4 == 10) {
      Vec_IntFree(pVVar8);
      Vec_IntFree(vLatches);
      return;
    }
    iVar7 = 0;
    uVar10 = 0;
    local_3c = uVar4;
    while( true ) {
      if (vLatches->nSize <= iVar7) break;
      iVar1 = Vec_IntEntry(vLatches,iVar7);
      pIVar6 = Ivy_ManObj(p_00,iVar1);
      if (pIVar6 == (Ivy_Obj_t *)0x0) break;
      uVar10 = (ulong)((int)uVar10 + (uint)((~*(uint *)&pIVar6->field_0x8 & 0x600) == 0));
      iVar7 = iVar7 + 1;
    }
    printf("Iter %d : Non-determinate = %d\n",(ulong)local_3c,uVar10);
    for (iVar7 = 0; iVar7 < pVVar8->nSize; iVar7 = iVar7 + 1) {
      iVar1 = Vec_IntEntry(pVVar8,iVar7);
      pIVar6 = Ivy_ManObj(p_00,iVar1);
      if (pIVar6 == (Ivy_Obj_t *)0x0) break;
      IVar2 = Ivy_InitNotCond(*(uint *)(((ulong)pIVar6->pFanin0 & 0xfffffffffffffffe) + 8) >> 9 &
                              IVY_INIT_DC,(uint)pIVar6->pFanin0 & 1);
      IVar3 = Ivy_InitNotCond(*(uint *)(((ulong)pIVar6->pFanin1 & 0xfffffffffffffffe) + 8) >> 9 &
                              IVY_INIT_DC,(uint)pIVar6->pFanin1 & 1);
      uVar4 = (uint)(IVar3 == IVY_INIT_1 && IVar2 == IVY_INIT_1) * 0x200 + 0x200;
      if (IVar3 == IVY_INIT_DC) {
        uVar4 = 0x600;
      }
      if (IVar2 == IVY_INIT_DC) {
        uVar4 = 0x600;
      }
      *(uint *)&pIVar6->field_0x8 = *(uint *)&pIVar6->field_0x8 & 0xfffff9ff | uVar4;
      pIVar9 = pIVar6->pEquiv;
      if ((pIVar9 != (Ivy_Obj_t *)0x0) && (0 < pIVar6->nRefs)) {
        if (((ulong)pIVar9 & 1) != 0) {
          __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                        ,0x1f6,"void Ivy_ManHaigSimulate(Ivy_Man_t *)");
        }
        IVar2 = uVar4 >> 9;
        for (; pIVar9 != pIVar6; pIVar9 = (Ivy_Obj_t *)((ulong)pIVar9->pEquiv & 0xfffffffffffffffe))
        {
          IVar3 = Ivy_InitNotCond(*(uint *)&pIVar9->field_0x8 >> 9 & IVY_INIT_DC,
                                  *(uint *)&pIVar9->pEquiv & 1);
          if (((IVar2 == IVY_INIT_0) && (IVar3 == IVY_INIT_1)) ||
             ((IVar2 == IVY_INIT_1 && (IVar3 == IVY_INIT_0)))) {
            puts("Compatibility fails.");
            IVar3 = IVY_INIT_0;
          }
          else if (IVar2 != IVY_INIT_DC) {
            IVar3 = IVar2;
          }
          IVar2 = IVar3;
        }
        *(Ivy_Init_t *)&pIVar6->field_0x8 =
             *(uint *)&pIVar6->field_0x8 & 0xfffff9ff | (IVar2 & IVY_INIT_DC) << 9;
      }
      pVVar8 = local_38;
    }
    for (iVar7 = 0; iVar7 < vLatches->nSize; iVar7 = iVar7 + 1) {
      iVar1 = Vec_IntEntry(vLatches,iVar7);
      pIVar6 = Ivy_ManObj(p_00,iVar1);
      if (pIVar6 == (Ivy_Obj_t *)0x0) break;
      *(uint *)&pIVar6->field_0x8 =
           (*(uint *)&pIVar6->field_0x8 & 0x7ff) +
           (*(uint *)(((ulong)pIVar6->pFanin0 & 0xfffffffffffffffe) + 8) & 0x600) * 4;
    }
    for (iVar7 = 0; iVar7 < vLatches->nSize; iVar7 = iVar7 + 1) {
      iVar1 = Vec_IntEntry(vLatches,iVar7);
      pIVar6 = Ivy_ManObj(p_00,iVar1);
      if (pIVar6 == (Ivy_Obj_t *)0x0) break;
      *(uint *)&pIVar6->field_0x8 =
           *(uint *)&pIVar6->field_0x8 & 0x1ff | *(uint *)&pIVar6->field_0x8 >> 2 & 0x600;
    }
    uVar4 = local_3c + 1;
  } while( true );
}

Assistant:

void Ivy_ManHaigSimulate( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes, * vLatches, * vLatchesD;
    Ivy_Obj_t * pObj, * pTemp;
    Ivy_Init_t In0, In1;
    int i, k, Counter;
    int fVerbose = 0;

    // check choices
    Ivy_ManCheckChoices( p );

    // switch to HAIG
    assert( p->pHaig != NULL );
    p = p->pHaig;

if ( fVerbose )
Ivy_ManForEachPi( p, pObj, i )
printf( "Setting PI %d\n", pObj->Id );

    // collect latches and nodes in the DFS order
    vNodes = Ivy_ManDfsSeq( p, &vLatches );

if ( fVerbose )
Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
printf( "Collected node %d with fanins %d and %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id, Ivy_ObjFanin1(pObj)->Id );

    // set the PI values
    Ivy_ManConst1(p)->Init = IVY_INIT_1;
    Ivy_ManForEachPi( p, pObj, i )
        pObj->Init = IVY_INIT_0;

    // set the latch values
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        pObj->Init = IVY_INIT_DC;
    // set the latches of D to be determinate
    vLatchesD = (Vec_Int_t *)p->pData;
    Ivy_ManForEachNodeVec( p, vLatchesD, pObj, i )
        pObj->Init = IVY_INIT_0;

    // perform several rounds of simulation
    for ( k = 0; k < 10; k++ )
    {
        // count the number of non-determinate values
        Counter = 0;
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
            Counter += ( pObj->Init == IVY_INIT_DC );
        printf( "Iter %d : Non-determinate = %d\n", k, Counter );    
        
        // simulate the internal nodes
        Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        {
if ( fVerbose )
printf( "Processing node %d with fanins %d and %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id, Ivy_ObjFanin1(pObj)->Id );
            In0 = Ivy_InitNotCond( (Ivy_Init_t)Ivy_ObjFanin0(pObj)->Init, Ivy_ObjFaninC0(pObj) );
            In1 = Ivy_InitNotCond( (Ivy_Init_t)Ivy_ObjFanin1(pObj)->Init, Ivy_ObjFaninC1(pObj) );
            pObj->Init = Ivy_ManHaigSimulateAnd( In0, In1 );
            // simulate the equivalence class if the node is a representative
            if ( pObj->pEquiv && Ivy_ObjRefs(pObj) > 0 )
            {
if ( fVerbose )
printf( "Processing choice node %d\n", pObj->Id );
                In0 = (Ivy_Init_t)pObj->Init;
                assert( !Ivy_IsComplement(pObj->pEquiv) );
                for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
                {
if ( fVerbose )
printf( "Processing secondary node %d\n", pTemp->Id );
                    In1 = Ivy_InitNotCond( (Ivy_Init_t)pTemp->Init, Ivy_IsComplement(pTemp->pEquiv) );
                    In0 = Ivy_ManHaigSimulateChoice( In0, In1 );
                }
                pObj->Init = In0;
            }
        }

        // simulate the latches
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        {
            pObj->Level = Ivy_ObjFanin0(pObj)->Init;
if ( fVerbose )
printf( "Using latch %d with fanin %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id );
        }
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
            pObj->Init = pObj->Level, pObj->Level = 0;
    }
    // free arrays
    Vec_IntFree( vNodes );
    Vec_IntFree( vLatches );
}